

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

void __thiscall
Parser::FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
          (Parser *this,ParseNodePtr pnodeScopeList,anon_class_16_2_9bc0f637 fn)

{
  Scanner_t *this_00;
  OpCode OVar1;
  LocalFunctionId funcId;
  Scope *pSVar2;
  ParseNodeFnc *pPVar3;
  ParseNodeVar *this_01;
  Symbol *pSVar4;
  ParseNodePtr *ppPVar5;
  ParseNodePtr *ppPVar6;
  Symbol *pSVar7;
  code *pcVar8;
  anon_class_32_4_34db34f2 handler;
  anon_class_32_4_34db34f2 handler_00;
  uint scopeId;
  undefined4 *puVar9;
  bool bVar10;
  ParseNodeBlock *pPVar11;
  ParseNodeCatch *pPVar12;
  ParseNodeFnc *pPVar13;
  PidRefStack *pPVar14;
  ParseNodeWith *pPVar15;
  ParseNodeFnc *pPVar16;
  ParseNodePtr pnodeArg;
  ParseNodeParamPattern *pPVar17;
  ParseNode *pPVar18;
  ParseNodeBlock *pnodeBlock;
  ParseNodePtr *ppPVar19;
  ParseContext *pPVar20;
  Parser *this_02;
  Scope *pSVar21;
  Parser *this_03;
  anon_class_32_4_34db34f2 local_98;
  ParseNodeBlock *local_78;
  ParseNodeVar *local_70;
  Scope *local_68;
  Scope *scope;
  Parser *local_58;
  LocalFunctionId local_4c;
  ParseNodeFnc *local_48;
  uint local_3c;
  undefined4 *puStack_38;
  uint blockId;
  
  pPVar20 = fn.parseContext;
  this_02 = fn.this;
  if (pnodeScopeList != (ParseNodePtr)0x0) {
    pSVar2 = this->m_currentScope;
    puStack_38 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    this_00 = &this_02->m_scan;
    local_58 = this;
    do {
      OVar1 = *(OpCode *)&((Scope *)pnodeScopeList)->enclosingScope;
      if (OVar1 < knopWith) {
        if (OVar1 == knopFncDecl) {
          scope = (Scope *)pnodeScopeList;
          pPVar13 = ParseNode::AsParseNodeFnc(pnodeScopeList);
          if ((pPVar13->super_ParseNode).nop != knopFncDecl) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = puStack_38;
            *puStack_38 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x2d6a,"(pnodeFnc->nop == knopFncDecl)",
                                "pnodeFnc->nop == knopFncDecl");
            if (!bVar10) goto LAB_00e70fae;
            *puVar9 = 0;
          }
          Scanner<UTF8EncodingPolicyBase<false>_>::Clear(this_00);
          Scanner<UTF8EncodingPolicyBase<false>_>::SetText
                    (this_00,pPVar20->pszSrc,pPVar13->cbMin,pPVar13->cbLim - pPVar13->cbMin,
                     (pPVar13->super_ParseNode).ichMin,pPVar20->isUtf8,pPVar20->grfscr,
                     pPVar13->lineNumber);
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
          pSVar21 = scope;
          if ((pPVar13->pnodeBody == (ParseNodePtr)0x0) &&
             ((pPVar13->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone)) {
            pPVar3 = this_02->m_currentNodeFunc;
            this_02->m_currentNodeFunc = pPVar13;
            this_01 = pPVar13->pnodeName;
            if (this_01 == (ParseNodeVar *)0x0) {
              local_78 = (ParseNodeBlock *)0x0;
            }
            else {
              if ((this_01->super_ParseNode).nop != knopVarDecl) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = puStack_38;
                *puStack_38 = 1;
                bVar10 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                    ,0x2d84,"(pnodeName->nop == knopVarDecl)",
                                    "pnodeName->nop == knopVarDecl");
                if (!bVar10) goto LAB_00e70fae;
                *puVar9 = 0;
              }
              local_48 = (ParseNodeFnc *)ParseNode::AsParseNodeVar(&this_01->super_ParseNode);
              if (local_48->pnodeNext != (ParseNodePtr)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = puStack_38;
                *puStack_38 = 1;
                bVar10 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                    ,0x2d86,"(pnodeVarName->pnodeNext == nullptr)",
                                    "pnodeVarName->pnodeNext == nullptr");
                if (!bVar10) goto LAB_00e70fae;
                *puVar9 = 0;
              }
              if ((pPVar13->fncFlags & kFunctionDeclaration) == kFunctionNone) {
                pPVar11 = StartParseBlock<true>(this_02,Function,ScopeType_FuncExpr,(LabelId *)0x0);
                pPVar16 = local_48;
                pPVar14 = PushPidRef(this_02,(IdentPtr)local_48->pnodeName);
                pPVar16->hint = (LPCOLESTR)&pPVar14->sym;
                pSVar4 = (Symbol *)pPVar16->pid;
                pPVar14->sym = pSVar4;
                pSVar21 = pPVar11->scope;
                local_78 = pPVar11;
                Scope::AddNewSymbol(pSVar21,pSVar4);
                pPVar13->scope = pSVar21;
              }
              else {
                local_78 = (ParseNodeBlock *)0x0;
              }
            }
            pPVar11 = StartParseBlock<true>(this_02,Parameter,ScopeType_Parameter,(LabelId *)0x0);
            pPVar13->pnodeScopes = pPVar11;
            this_02->m_ppnodeScope = &pPVar11->pnodeScopes;
            pPVar11->pnodeStmt = &pPVar13->super_ParseNode;
            ppPVar19 = &pPVar13->pnodeVars;
            if (((pPVar13->fncFlags & (kFunctionIsLambda|kFunctionIsModule)) == kFunctionNone) &&
               (((pPVar13->super_ParseNode).grfpn & 2) == 0)) {
              ppPVar5 = this_02->m_ppnodeVar;
              this_02->m_ppnodeVar = ppPVar19;
              local_70 = AddArgumentsNodeToVars(this_02,pPVar13);
              ppPVar19 = this_02->m_ppnodeVar;
              this_02->m_ppnodeVar = ppPVar5;
            }
            else {
              local_70 = (ParseNodeVar *)0x0;
            }
            local_68 = pPVar11->scope;
            local_3c = this_02->m_currentBlockInfo->pnodeBlock->blockId;
            pPVar16 = GetCurrentFunctionNode(this_02);
            local_4c = pPVar16->functionId;
            local_98.blockId = &local_3c;
            local_98.funcId = &local_4c;
            local_98.scope = &local_68;
            local_98.this = this_02;
            for (pnodeArg = pPVar13->pnodeParams; pnodeArg != (ParseNodePtr)0x0;
                pnodeArg = ParseNode::GetFormalNext(pnodeArg)) {
              FinishDeferredFunction::anon_class_16_2_9bc0f637::operator()::anon_class_32_4_34db34f2
              ::operator()(&local_98,pnodeArg);
            }
            if (pPVar13->pnodeRest != (ParseNodePtr)0x0) {
              FinishDeferredFunction::anon_class_16_2_9bc0f637::operator()::anon_class_32_4_34db34f2
              ::operator()(&local_98,pPVar13->pnodeRest);
            }
            puVar9 = puStack_38;
            local_98.blockId = &local_3c;
            local_98.funcId = &local_4c;
            local_98.scope = &local_68;
            local_48 = pPVar13;
            local_98.this = this_02;
            for (pPVar18 = pPVar13->pnodeParams; pPVar18 != (ParseNode *)0x0;
                pPVar18 = ParseNode::GetFormalNext(pPVar18)) {
              if (pPVar18->nop == knopParamPattern) {
                pPVar17 = ParseNode::AsParseNodeParamPattern(pPVar18);
                handler.blockId._0_4_ = (int)local_98.blockId;
                handler.this = local_98.this;
                handler.blockId._4_4_ = (int)((ulong)local_98.blockId >> 0x20);
                handler.funcId = local_98.funcId;
                handler.scope = local_98.scope;
                operator()((pPVar17->super_ParseNodeUni).pnode1,handler);
              }
            }
            pPVar18 = local_48->pnodeRest;
            if ((pPVar18 != (ParseNode *)0x0) && (pPVar18->nop == knopParamPattern)) {
              pPVar17 = ParseNode::AsParseNodeParamPattern(pPVar18);
              handler_00.blockId._0_4_ = (int)local_98.blockId;
              handler_00.this = local_98.this;
              handler_00.blockId._4_4_ = (int)((ulong)local_98.blockId >> 0x20);
              handler_00.funcId = local_98.funcId;
              handler_00.scope = local_98.scope;
              operator()((pPVar17->super_ParseNodeUni).pnode1,handler_00);
            }
            pnodeBlock = StartParseBlock<true>
                                   (this_02,Function,ScopeType_FunctionBody,(LabelId *)0x0);
            local_48->pnodeBodyScope = pnodeBlock;
            *this_02->m_ppnodeScope = (ParseNodePtr)pnodeBlock;
            ppPVar5 = this_02->m_ppnodeScope;
            this_02->m_ppnodeScope = &pnodeBlock->pnodeScopes;
            pnodeBlock->pnodeStmt = &local_48->super_ParseNode;
            ppPVar6 = this_02->m_ppnodeExprScope;
            this_02->m_ppnodeExprScope = (ParseNodePtr *)0x0;
            if (*this_02->m_ppnodeVar != (ParseNodePtr)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                  ,0x2dda,"(*m_ppnodeVar == nullptr)","*m_ppnodeVar == nullptr");
              if (!bVar10) goto LAB_00e70fae;
              *puVar9 = 0;
            }
            this_02->m_ppnodeVar = ppPVar19;
            if (local_68 != (Scope *)0x0) {
              if (local_48->isBodyAndParamScopeMerged == false) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = puStack_38;
                *puStack_38 = 1;
                bVar10 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                    ,0x2de1,"(pnodeFnc->IsBodyAndParamScopeMerged())",
                                    "pnodeFnc->IsBodyAndParamScopeMerged()");
                if (!bVar10) goto LAB_00e70fae;
                *puVar9 = 0;
              }
              local_3c = this_02->m_currentBlockInfo->pnodeBlock->blockId;
              pPVar13 = GetCurrentFunctionNode(this_02);
              scopeId = local_3c;
              funcId = pPVar13->functionId;
              local_4c = funcId;
              pSVar4 = local_68->m_symList;
              while (pSVar4 != (Symbol *)0x0) {
                pSVar7 = pSVar4->next;
                pPVar14 = FindOrAddPidRef(this_02,pSVar4->pid,scopeId,funcId);
                pPVar14->sym = pSVar4;
                pSVar4 = pSVar7;
              }
            }
            puVar9 = puStack_38;
            this = local_58;
            pSVar21 = scope;
            if (this_02->m_currentNodeNonLambdaFunc != (ParseNodeFnc *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                  ,0x2deb,"(m_currentNodeNonLambdaFunc == nullptr)",
                                  "m_currentNodeNonLambdaFunc == nullptr");
              if (!bVar10) goto LAB_00e70fae;
              *puVar9 = 0;
            }
            pPVar13 = local_48;
            this_02->m_currentNodeNonLambdaFunc = local_48;
            FinishFncNode(this_02,local_48,true);
            if (this_02->m_currentNodeNonLambdaFunc != pPVar13) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                  ,0x2df0,"(pnodeFnc == m_currentNodeNonLambdaFunc)",
                                  "pnodeFnc == m_currentNodeNonLambdaFunc");
              if (!bVar10) goto LAB_00e70fae;
              *puVar9 = 0;
            }
            pPVar13 = local_48;
            this_02->m_currentNodeNonLambdaFunc = (ParseNodeFnc *)0x0;
            this_02->m_ppnodeExprScope = ppPVar6;
            ppPVar19 = this_02->m_ppnodeScope;
            if (ppPVar19 == (ParseNodePtr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = puStack_38;
              *puStack_38 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                  ,0x2df5,"(m_ppnodeScope)","m_ppnodeScope");
              if (!bVar10) goto LAB_00e70fae;
              *puVar9 = 0;
              ppPVar19 = this_02->m_ppnodeScope;
              pSVar21 = scope;
            }
            if (*ppPVar19 != (ParseNodePtr)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = puStack_38;
              *puStack_38 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                  ,0x2df6,"(nullptr == *m_ppnodeScope)","nullptr == *m_ppnodeScope")
              ;
              if (!bVar10) goto LAB_00e70fae;
              *puVar9 = 0;
              pSVar21 = scope;
            }
            this_02->m_ppnodeScope = ppPVar5;
            this_03 = this_02;
            FinishParseBlock(this_02,pnodeBlock,true);
            if (((pPVar13->fncFlags >> 10 & 1) == 0) &&
               (((pPVar13->fncFlags >> 0xd & 1) == 0 || ((this_02->m_token).tk == tkLCurly)))) {
              UpdateArgumentsNode(this_03,pPVar13,local_70);
            }
            CreateSpecialSymbolDeclarations(this_02,pPVar13);
            FinishParseBlock(this_02,pPVar11,true);
            if (local_78 != (ParseNodeBlock *)0x0) {
              FinishParseBlock(this_02,local_78,true);
            }
            this_02->m_currentNodeFunc = pPVar3;
          }
          pPVar13 = ParseNode::AsParseNodeFnc((ParseNode *)pSVar21);
          ppPVar19 = &pPVar13->pnodeNext;
        }
        else {
          if (OVar1 != knopBlock) {
LAB_00e70f5b:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = puStack_38;
            *puStack_38 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x2d40,"(false)","Unexpected node with scope list");
            if (bVar10) {
              *puVar9 = 0;
              return;
            }
LAB_00e70fae:
            pcVar8 = (code *)invalidInstructionException();
            (*pcVar8)();
          }
          pPVar11 = ParseNode::AsParseNodeBlock(pnodeScopeList);
          this->m_nextBlockId = pPVar11->blockId + 1;
          PushBlockInfo(this,pPVar11);
          this = local_58;
          pSVar21 = pPVar11->scope;
          if ((pSVar21 == (Scope *)0x0) || (pSVar21 == pSVar2)) {
            FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                      (local_58,pPVar11->pnodeScopes,fn);
          }
          else {
            Scope::SetEnclosingScope(pSVar21,local_58->m_currentScope);
            this->m_currentScope = pSVar21;
            FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                      (this,pPVar11->pnodeScopes,fn);
            BindPidRefs<false>(this,this->m_currentBlockInfo,this->m_nextBlockId - 1);
            PopScope(this,pSVar21);
          }
          PopBlockInfo(this);
          ppPVar19 = &pPVar11->pnodeNext;
        }
      }
      else if (OVar1 == knopWith) {
        pPVar11 = CreateBlockNode(this,Regular);
        PushBlockInfo(this,pPVar11);
        PushDynamicBlock(this);
        pPVar15 = ParseNode::AsParseNodeWith(pnodeScopeList);
        FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                  (this,pPVar15->pnodeScopes,fn);
        PopBlockInfo(this);
        pPVar15 = ParseNode::AsParseNodeWith(pnodeScopeList);
        ppPVar19 = &pPVar15->pnodeNext;
      }
      else {
        if (OVar1 != knopCatch) goto LAB_00e70f5b;
        pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
        this = local_58;
        pSVar21 = pPVar12->scope;
        if (pSVar21 == (Scope *)0x0) {
          pPVar11 = CreateBlockNode(local_58,Regular);
          pPVar11->scope = (Scope *)0x0;
          PushBlockInfo(this,pPVar11);
          pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
          FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                    (this,pPVar12->pnodeScopes,fn);
        }
        else {
          Scope::SetEnclosingScope(pSVar21,local_58->m_currentScope);
          this->m_currentScope = pSVar21;
          pPVar11 = CreateBlockNode(this,Regular);
          pPVar11->scope = pSVar21;
          PushBlockInfo(this,pPVar11);
          pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
          FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                    (this,pPVar12->pnodeScopes,fn);
          BindPidRefs<false>(this,this->m_currentBlockInfo,this->m_nextBlockId - 1);
          PopScope(this,pSVar21);
        }
        PopBlockInfo(this);
        pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
        ppPVar19 = &pPVar12->pnodeNext;
      }
      pnodeScopeList = *ppPVar19;
    } while ((Scope *)pnodeScopeList != (Scope *)0x0);
  }
  return;
}

Assistant:

void Parser::FinishFunctionsInScope(ParseNodePtr pnodeScopeList, Fn fn)
{
    Scope * scope;
    Scope * origCurrentScope = this->m_currentScope;
    ParseNodePtr pnodeScope;
    ParseNodeBlock * pnodeBlock;
    for (pnodeScope = pnodeScopeList; pnodeScope;)
    {
        switch (pnodeScope->nop)
        {
        case knopBlock:
        {
            ParseNodeBlock * pnodeBlockScope = pnodeScope->AsParseNodeBlock();
            m_nextBlockId = pnodeBlockScope->blockId + 1;
            PushBlockInfo(pnodeBlockScope);
            scope = pnodeBlockScope->scope;
            if (scope && scope != origCurrentScope)
            {
                PushScope(scope);
            }
            FinishFunctionsInScope(pnodeBlockScope->pnodeScopes, fn);
            if (scope && scope != origCurrentScope)
            {
                BindPidRefs<false>(GetCurrentBlockInfo(), m_nextBlockId - 1);
                PopScope(scope);
            }
            PopBlockInfo();
            pnodeScope = pnodeBlockScope->pnodeNext;
            break;
        }
        case knopFncDecl:
            fn(pnodeScope->AsParseNodeFnc());
            pnodeScope = pnodeScope->AsParseNodeFnc()->pnodeNext;
            break;

        case knopCatch:
            scope = pnodeScope->AsParseNodeCatch()->scope;
            if (scope)
            {
                PushScope(scope);
            }
            pnodeBlock = CreateBlockNode(PnodeBlockType::Regular);
            pnodeBlock->scope = scope;
            PushBlockInfo(pnodeBlock);
            FinishFunctionsInScope(pnodeScope->AsParseNodeCatch()->pnodeScopes, fn);
            if (scope)
            {
                BindPidRefs<false>(GetCurrentBlockInfo(), m_nextBlockId - 1);
                PopScope(scope);
            }
            PopBlockInfo();
            pnodeScope = pnodeScope->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
            PushBlockInfo(CreateBlockNode());
            PushDynamicBlock();
            FinishFunctionsInScope(pnodeScope->AsParseNodeWith()->pnodeScopes, fn);
            PopBlockInfo();
            pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
            break;

        default:
            AssertMsg(false, "Unexpected node with scope list");
            return;
        }
    }
}